

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O1

int sint1f_(int *n,int *inc,double *x,int *lenx,double *wsave,int *lensav,double *work,int *lenwrk,
           int *ier)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  int local_34;
  
  *ier = 0;
  iVar1 = *n;
  iVar3 = 1;
  if ((iVar1 + -1) * *inc < *lenx) {
    iVar2 = *lensav;
    dVar4 = log((double)iVar1);
    iVar3 = 2;
    if ((int)(dVar4 / 0.6931471805599453) + iVar1 / 2 + iVar1 + 4 <= iVar2) {
      iVar3 = 3;
      if (*n * 2 + 2 <= *lenwrk) {
        sintf1_(n,inc,x,wsave,work,work + (long)*n + 1,&local_34);
        iVar3 = 0x14;
        if (local_34 == 0) {
          return 0;
        }
      }
    }
  }
  *ier = iVar3;
  return 0;
}

Assistant:

int sint1f_(int *n, int *inc, fft_real_t *x, int *lenx,
	 fft_real_t *wsave, int *lensav, fft_real_t *work, int *lenwrk, int *
	ier)
{
    /* System generated locals */
    int x_dim1, x_offset;

    /* Builtin functions */


    /* Local variables */
     int ier1;
    extern /* Subroutine */ int sintf1_(int *, int *, fft_real_t *, fft_real_t *,
	    fft_real_t *, fft_real_t *, int *), xerfft_(char *, int *, ftnlen);


    /* Parameter adjustments */
    x_dim1 = *inc;
    x_offset = 1 + x_dim1;
    x -= x_offset;
    --wsave;
    --work;

    /* Function Body */
    *ier = 0;
    if (*lenx < *inc * (*n - 1) + 1) {
	*ier = 1;
	//xerfft_("SINT1F", &c__6, (ftnlen)6);
	goto L100;
    } else if (*lensav < *n / 2 + *n + (int) (log((fft_real_t) (*n)) / log(2.0))
	     + 4) {
	*ier = 2;
	//xerfft_("SINT1F", &c__8, (ftnlen)6);
	goto L100;
    } else if (*lenwrk < (*n << 1) + 2) {
	*ier = 3;
	//xerfft_("SINT1F", &c__10, (ftnlen)6);
	goto L100;
    }

    sintf1_(n, inc, &x[x_offset], &wsave[1], &work[1], &work[*n + 2], &ier1);
    if (ier1 != 0) {
	*ier = 20;
	//xerfft_("SINT1F", &c_n5, (ftnlen)6);
    }
L100:
    return 0;
}